

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)16>_> *
vkt::sparse::makePipelineLayout
          (Move<vk::Handle<(vk::HandleType)16>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkDescriptorSetLayout descriptorSetLayout)

{
  bool bVar1;
  DeviceInterface **local_88;
  Handle<(vk::HandleType)19> local_68;
  Handle<(vk::HandleType)19> local_60;
  undefined1 local_58 [8];
  VkPipelineLayoutCreateInfo pipelineLayoutParams;
  VkDevice device_local;
  DeviceInterface *vk_local;
  VkDescriptorSetLayout descriptorSetLayout_local;
  
  local_58._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineLayoutParams._4_4_ = 0;
  pipelineLayoutParams.pNext._0_4_ = 0;
  pipelineLayoutParams.pPushConstantRanges = (VkPushConstantRange *)device;
  vk_local = (DeviceInterface *)descriptorSetLayout.m_internal;
  descriptorSetLayout_local.m_internal = (deUint64)__return_storage_ptr__;
  ::vk::Handle<(vk::HandleType)19>::Handle(&local_60,0);
  bVar1 = ::vk::Handle<(vk::HandleType)19>::operator!=
                    ((Handle<(vk::HandleType)19> *)&vk_local,&local_60);
  pipelineLayoutParams.pNext._4_4_ = (uint)bVar1;
  ::vk::Handle<(vk::HandleType)19>::Handle(&local_68,0);
  bVar1 = ::vk::Handle<(vk::HandleType)19>::operator!=
                    ((Handle<(vk::HandleType)19> *)&vk_local,&local_68);
  if (bVar1) {
    local_88 = &vk_local;
  }
  else {
    local_88 = (DeviceInterface **)0x0;
  }
  pipelineLayoutParams._16_8_ = local_88;
  pipelineLayoutParams.pSetLayouts._0_4_ = 0;
  pipelineLayoutParams.pushConstantRangeCount = 0;
  pipelineLayoutParams._36_4_ = 0;
  ::vk::createPipelineLayout
            (__return_storage_ptr__,vk,(VkDevice)pipelineLayoutParams.pPushConstantRanges,
             (VkPipelineLayoutCreateInfo *)local_58,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipelineLayout> makePipelineLayout (const DeviceInterface&		vk,
										   const VkDevice				device,
										   const VkDescriptorSetLayout	descriptorSetLayout)
{
	const VkPipelineLayoutCreateInfo pipelineLayoutParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,						// VkStructureType					sType;
		DE_NULL,															// const void*						pNext;
		0u,																	// VkPipelineLayoutCreateFlags		flags;
		(descriptorSetLayout != DE_NULL ? 1u : 0u),							// deUint32							setLayoutCount;
		(descriptorSetLayout != DE_NULL ? &descriptorSetLayout : DE_NULL),	// const VkDescriptorSetLayout*		pSetLayouts;
		0u,																	// deUint32							pushConstantRangeCount;
		DE_NULL,															// const VkPushConstantRange*		pPushConstantRanges;
	};
	return createPipelineLayout(vk, device, &pipelineLayoutParams);
}